

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_average_face_to_cellcenter(MultiFab *ccmf,int dcomp,Array<const_MultiFab_*,_3> *fmf)

{
  double dVar1;
  int iVar2;
  int iVar3;
  EBCellFlagFab *this;
  Array<const_MultiFab_*,_3> *pAVar4;
  bool bVar5;
  FabType FVar6;
  uint uVar7;
  EBFArrayBoxFactory *this_00;
  int *piVar8;
  uint32_t *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  undefined8 *puVar31;
  uint32_t *puVar32;
  long lVar33;
  long lVar34;
  double dVar35;
  MFIter mfi;
  long local_368;
  long local_350;
  Box local_33c;
  long local_320;
  double *local_318;
  long local_310;
  uint32_t *local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  double *local_2e0;
  long local_2d8;
  ulong local_2d0;
  FabArray<amrex::FArrayBox> *local_2c8;
  long local_2c0;
  long local_2b8;
  Array4<double> local_2b0;
  FabArray<amrex::EBCellFlagFab> *local_270;
  Array<const_MultiFab_*,_3> *local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  Array4<const_double> local_240;
  Array4<const_double> local_200;
  Array4<const_double> local_1c0;
  Array<const_MultiCutFab_*,_3> local_180;
  MFIter local_168;
  Array4<const_double> local_108;
  Array4<const_double> local_c8;
  Array4<const_double> local_88;
  MFItInfo local_44;
  
  bVar5 = FabArray<amrex::FArrayBox>::hasEBFabFactory
                    (&fmf->_M_elems[0]->super_FabArray<amrex::FArrayBox>);
  if (!bVar5) {
    average_face_to_cellcenter(ccmf,dcomp,fmf,0);
    return;
  }
  local_2c8 = &ccmf->super_FabArray<amrex::FArrayBox>;
  this_00 = (EBFArrayBoxFactory *)
            __dynamic_cast((fmf->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
  if (this_00 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  local_270 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
  EBFArrayBoxFactory::getAreaFrac(&local_180,this_00);
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_007d7ef0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter(&local_168,&local_2c8->super_FabArrayBase,&local_44);
  local_2e8 = (long)dcomp << 3;
  local_2b8 = (long)(dcomp + 1) << 3;
  local_2c0 = (long)(dcomp + 2) << 3;
  local_268 = fmf;
  while (local_168.currentIndex < local_168.endIndex) {
    MFIter::tilebox(&local_33c,&local_168);
    piVar8 = &local_168.currentIndex;
    if (local_168.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar8 = ((local_168.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + local_168.currentIndex;
    }
    this = (local_270->m_fabs_v).
           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
           _M_impl.super__Vector_impl_data._M_start[*piVar8];
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_2b0,local_2c8,&local_168);
    pAVar4 = local_268;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_1c0,&local_268->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_168);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_200,&pAVar4->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_168);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_240,&pAVar4->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_168);
    FVar6 = EBCellFlagFab::getType(this,&local_33c);
    if (FVar6 == regular) {
      local_308 = (uint32_t *)(long)local_33c.smallend.vect[1];
      local_310 = (long)local_33c.smallend.vect[0] * 8;
      lVar17 = (long)local_33c.smallend.vect[2];
      iVar2 = local_33c.smallend.vect[2];
      while (iVar2 = iVar2 + 1, (int)lVar17 <= local_33c.bigend.vect[2]) {
        local_2d0 = (ulong)local_1c0.begin.y;
        lVar12 = (long)local_2b0.begin.x;
        lVar28 = lVar17 - local_1c0.begin.z;
        lVar18 = (lVar17 - local_2b0.begin.z) * local_2b0.kstride;
        local_2d8 = (long)local_2b0.p +
                    local_2b0.nstride * local_2c0 + lVar18 * 8 + lVar12 * -8 + local_310;
        local_300 = lVar17 + 1;
        local_2e0 = local_200.p +
                    (long)local_33c.smallend.vect[0] +
                    ((lVar17 - local_200.begin.z) * local_200.kstride - (long)local_200.begin.x);
        lVar25 = lVar17 - local_240.begin.z;
        local_2f0 = (long)local_240.begin.y;
        local_320 = (long)local_240.p +
                    (long)(iVar2 - local_240.begin.z) * local_240.kstride * 8 +
                    (long)local_240.begin.x * -8 + local_310;
        local_318 = (double *)(local_1c0.jstride * 8);
        local_2f8 = local_240.jstride * 8;
        puVar9 = local_308;
        while (lVar17 = local_300, (long)puVar9 <= (long)local_33c.bigend.vect[1]) {
          if (local_33c.bigend.vect[0] < local_33c.smallend.vect[0]) {
            puVar9 = (uint32_t *)((long)puVar9 + 1);
          }
          else {
            lVar17 = ((long)puVar9 - local_2d0) * (long)local_318 +
                     lVar28 * local_1c0.kstride * 8 + (long)local_1c0.begin.x * -8 + local_310;
            lVar27 = ((long)puVar9 - (long)local_2b0.begin.y) * local_2b0.jstride * 8;
            lVar19 = (long)puVar9 - (long)local_200.begin.y;
            puVar32 = (uint32_t *)((long)puVar9 + 1);
            lVar29 = ((long)puVar9 - local_2f0) * local_2f8;
            lVar33 = 0;
            do {
              *(double *)
               ((long)local_2b0.p +
               lVar33 * 8 +
               lVar27 + local_2e8 * local_2b0.nstride + lVar18 * 8 + lVar12 * -8 + local_310) =
                   (*(double *)((long)local_1c0.p + lVar33 * 8 + lVar17) +
                   *(double *)((long)local_1c0.p + lVar33 * 8 + lVar17 + 8)) * 0.5;
              *(double *)
               ((long)local_2b0.p +
               lVar33 * 8 +
               lVar27 + local_2b8 * local_2b0.nstride + lVar18 * 8 + lVar12 * -8 + local_310) =
                   (*(double *)((long)local_2e0 + lVar33 * 8 + lVar19 * local_200.jstride * 8) +
                   *(double *)
                    ((long)local_2e0 +
                    lVar33 * 8 + (long)((int)puVar32 - local_200.begin.y) * local_200.jstride * 8))
                   * 0.5;
              *(double *)(lVar27 + local_2d8 + lVar33 * 8) =
                   (*(double *)
                     ((long)local_240.p +
                     lVar33 * 8 +
                     lVar29 + lVar25 * local_240.kstride * 8 + (long)local_240.begin.x * -8 +
                              local_310) + *(double *)(local_320 + lVar29 + lVar33 * 8)) * 0.5;
              lVar33 = lVar33 + 1;
              puVar9 = puVar32;
            } while ((local_33c.bigend.vect[0] - local_33c.smallend.vect[0]) + 1 != (int)lVar33);
          }
        }
      }
    }
    else if (FVar6 == covered) {
      for (lVar17 = (long)local_33c.smallend.vect[2]; lVar12 = (long)local_33c.smallend.vect[1],
          (int)lVar17 <= local_33c.bigend.vect[2]; lVar17 = lVar17 + 1) {
        for (; (int)lVar12 <= local_33c.bigend.vect[1]; lVar12 = lVar12 + 1) {
          puVar31 = (undefined8 *)
                    ((long)local_2b0.p +
                    local_2b0.nstride * local_2e8 +
                    (lVar12 - local_2b0.begin.y) * local_2b0.jstride * 8 +
                    (lVar17 - local_2b0.begin.z) * local_2b0.kstride * 8 +
                    (long)local_2b0.begin.x * -8 + (long)local_33c.smallend.vect[0] * 8);
          for (lVar18 = (long)local_33c.smallend.vect[0]; lVar18 <= local_33c.bigend.vect[0];
              lVar18 = lVar18 + 1) {
            *puVar31 = 0;
            puVar31 = puVar31 + 1;
          }
        }
      }
    }
    else {
      MultiCutFab::const_array(&local_88,local_180._M_elems[0],&local_168);
      MultiCutFab::const_array(&local_c8,local_180._M_elems[1],&local_168);
      MultiCutFab::const_array(&local_108,local_180._M_elems[2],&local_168);
      iVar2 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
      iVar3 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      lVar25 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] - iVar2) + 1);
      lVar28 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] - iVar3) + 1);
      lVar18 = (long)local_33c.smallend.vect[0];
      local_258 = (long)local_33c.smallend.vect[1];
      local_350 = (long)local_33c.smallend.vect[2];
      local_2f8 = (long)local_33c.bigend.vect[1];
      local_248 = (long)local_33c.bigend.vect[2];
      lVar17 = lVar18 * 8;
      local_260 = local_258 + 1;
      lVar29 = lVar28 * lVar25;
      local_250 = lVar29 * 4;
      local_300 = lVar25 * 4;
      lVar12 = local_350;
      puVar9 = (uint32_t *)
               ((long)&(this->super_BaseFab<amrex::EBCellFlag>).dptr[lVar18 - iVar2].flag +
               (local_258 * 4 +
                (local_350 - (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2]) *
                lVar28 * 4 + (long)iVar3 * -4) * lVar25);
      while (puVar32 = puVar9, local_350 = local_350 + 1, lVar12 <= local_248) {
        local_310 = lVar12 + 1;
        lVar28 = local_258;
        puVar9 = puVar32;
        local_368 = local_260;
        while (lVar19 = lVar28, lVar19 <= local_2f8) {
          lVar30 = (lVar19 - local_1c0.begin.y) * local_1c0.jstride;
          lVar34 = (lVar12 - local_1c0.begin.z) * local_1c0.kstride;
          local_318 = local_1c0.p + lVar30 + lVar34;
          lVar10 = (long)local_2b0.begin.x;
          lVar20 = (long)local_200.begin.x;
          lVar28 = (lVar19 - local_2b0.begin.y) * local_2b0.jstride * 8 +
                   (lVar12 - local_2b0.begin.z) * local_2b0.kstride * 8;
          lVar27 = local_2b8 * local_2b0.nstride + lVar28 + lVar10 * -8 + lVar17;
          lVar33 = local_2e8 * local_2b0.nstride + lVar28 + lVar10 * -8 + lVar17;
          lVar28 = local_2b0.nstride * local_2c0 + lVar28 + lVar10 * -8 + lVar17;
          uVar7 = (local_33c.smallend.vect[0] + 1) - local_1c0.begin.x;
          local_2d0 = (ulong)uVar7;
          lVar22 = local_200.jstride * 8;
          lVar26 = (lVar12 - local_200.begin.z) * local_200.kstride;
          local_2d8 = (long)local_200.p +
                      (local_368 - local_200.begin.y) * lVar22 + lVar26 * 8 + lVar20 * -8 + lVar17;
          lVar13 = (lVar19 - local_240.begin.y) * local_240.jstride;
          lVar11 = local_240.kstride * 8;
          lVar14 = (long)local_240.begin.x;
          lVar10 = (lVar12 - local_240.begin.z) * lVar11 + lVar13 * 8 + lVar14 * -8 + lVar17;
          local_2e0 = (double *)
                      ((long)local_240.p +
                      (local_350 - local_240.begin.z) * lVar11 + lVar13 * 8 + lVar14 * -8 + lVar17);
          lVar15 = (lVar19 - local_108.begin.y) * local_108.jstride;
          lVar16 = (lVar12 - local_c8.begin.z) * local_c8.kstride;
          lVar21 = (lVar12 - local_88.begin.z) * local_88.kstride;
          local_2f0 = lVar19 + 1;
          lVar23 = (lVar19 - local_88.begin.y) * local_88.jstride;
          for (lVar24 = 0; lVar18 + lVar24 <= (long)local_33c.bigend.vect[0]; lVar24 = lVar24 + 1) {
            if ((~puVar9[lVar24] & 3) == 0) {
              *(undefined8 *)((long)local_2b0.p + lVar24 * 8 + lVar33) = 0;
              *(undefined8 *)((long)local_2b0.p + lVar24 * 8 + lVar27) = 0;
              *(undefined8 *)((long)local_2b0.p + lVar24 * 8 + lVar28) = 0;
            }
            else {
              if ((local_88.p[lVar18 + ((lVar21 + lVar23 + lVar24) - (long)local_88.begin.x)] != 0.0
                  ) || (NAN(local_88.p
                            [lVar18 + ((lVar21 + lVar23 + lVar24) - (long)local_88.begin.x)]))) {
                dVar35 = local_1c0.p
                         [lVar18 + ((lVar34 + lVar30 + lVar24) - (long)local_1c0.begin.x)];
                if ((local_88.p[lVar18 + ((lVar21 + lVar23 + lVar24 + 1) - (long)local_88.begin.x)]
                     != 0.0) ||
                   (NAN(local_88.p
                        [lVar18 + ((lVar21 + lVar23 + lVar24 + 1) - (long)local_88.begin.x)]))) {
                  dVar35 = (dVar35 + local_1c0.p
                                     [lVar18 + ((lVar34 + lVar30 + lVar24 + 1) -
                                               (long)local_1c0.begin.x)]) * 0.5;
                }
              }
              else {
                dVar35 = local_318[(int)(uVar7 + (int)lVar24)];
              }
              *(double *)((long)local_2b0.p + lVar24 * 8 + lVar33) = dVar35;
              dVar35 = *(double *)
                        ((long)local_c8.p +
                        lVar24 * 8 +
                        (lVar19 - local_c8.begin.y) * local_c8.jstride * 8 + lVar16 * 8 +
                        (long)local_c8.begin.x * -8 + lVar17);
              if ((dVar35 != 0.0) || (NAN(dVar35))) {
                dVar1 = *(double *)
                         ((long)local_c8.p +
                         lVar24 * 8 +
                         (local_368 - local_c8.begin.y) * local_c8.jstride * 8 + lVar16 * 8 +
                         (long)local_c8.begin.x * -8 + lVar17);
                dVar35 = *(double *)
                          ((long)local_200.p +
                          lVar24 * 8 +
                          (lVar19 - local_200.begin.y) * lVar22 + lVar26 * 8 + lVar20 * -8 + lVar17)
                ;
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  dVar35 = (dVar35 + *(double *)(local_2d8 + lVar24 * 8)) * 0.5;
                }
              }
              else {
                dVar35 = *(double *)
                          ((long)local_200.p +
                          lVar24 * 8 +
                          ((int)local_368 - local_200.begin.y) * lVar22 + lVar26 * 8 + lVar20 * -8 +
                          lVar17);
              }
              *(double *)((long)local_2b0.p + lVar24 * 8 + lVar27) = dVar35;
              dVar35 = *(double *)
                        ((long)local_108.p +
                        lVar24 * 8 +
                        (lVar12 - local_108.begin.z) * local_108.kstride * 8 + lVar15 * 8 +
                        (long)local_108.begin.x * -8 + lVar17);
              if ((dVar35 != 0.0) || (NAN(dVar35))) {
                dVar35 = *(double *)
                          ((long)local_108.p +
                          lVar24 * 8 +
                          (local_350 - local_108.begin.z) * local_108.kstride * 8 + lVar15 * 8 +
                          (long)local_108.begin.x * -8 + lVar17);
                if ((dVar35 != 0.0) || (NAN(dVar35))) {
                  dVar35 = (*(double *)((long)local_240.p + lVar24 * 8 + lVar10) + local_2e0[lVar24]
                           ) * 0.5;
                }
                else {
                  dVar35 = *(double *)((long)local_240.p + lVar24 * 8 + lVar10);
                }
              }
              else {
                dVar35 = *(double *)
                          ((long)local_240.p +
                          lVar24 * 8 +
                          ((int)local_350 - local_240.begin.z) * lVar11 + lVar13 * 8 + lVar14 * -8 +
                          lVar17);
              }
              *(double *)((long)local_2b0.p + lVar24 * 8 + lVar28) = dVar35;
            }
          }
          local_368 = local_368 + 1;
          puVar9 = puVar9 + lVar25;
          lVar28 = local_2f0;
          local_320 = lVar19;
        }
        lVar12 = local_310;
        puVar9 = puVar32 + lVar29;
        local_308 = puVar32;
      }
    }
    MFIter::operator++(&local_168);
  }
  MFIter::~MFIter(&local_168);
  return;
}

Assistant:

void
EB_average_face_to_cellcenter (MultiFab& ccmf, int dcomp,
                               const Array<MultiFab const*,AMREX_SPACEDIM>& fmf)
{
    AMREX_ASSERT(ccmf.nComp() >= dcomp + AMREX_SPACEDIM);

    if (!fmf[0]->hasEBFabFactory())
    {
        average_face_to_cellcenter(ccmf, dcomp, fmf);
    }
    else
    {
        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(fmf[0]->Factory());
        const auto& flags = factory.getMultiEBCellFlagFab();
        const auto& area = factory.getAreaFrac();

        MFItInfo info;
        if (Gpu::notInLaunchRegion()) info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(ccmf,info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            const auto& flagfab = flags[mfi];
            Array4<Real> const& ccfab = ccmf.array(mfi);
            AMREX_D_TERM(Array4<Real const> const& xfab = fmf[0]->const_array(mfi);,
                         Array4<Real const> const& yfab = fmf[1]->const_array(mfi);,
                         Array4<Real const> const& zfab = fmf[2]->const_array(mfi));
            const auto fabtyp = flagfab.getType(bx);
            if (fabtyp == FabType::covered) {
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    ccfab(i,j,k,dcomp) = 0.0;
                });
            } else if (fabtyp == FabType::regular) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k,ccfab,AMREX_D_DECL(xfab,yfab,zfab),dcomp);
                });
            } else {
                AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                             Array4<Real const> const& apy = area[1]->const_array(mfi);,
                             Array4<Real const> const& apz = area[2]->const_array(mfi));
                Array4<EBCellFlag const> const& flagarr = flagfab.const_array();
                AMREX_HOST_DEVICE_FOR_3D(bx,i,j,k,
                {
                    eb_avg_fc_to_cc(i,j,k,dcomp,ccfab,AMREX_D_DECL(xfab,yfab,zfab),
                                    AMREX_D_DECL(apx,apy,apz),flagarr);
                });
            }
        }
    }
}